

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

int nng_msg_trim_u16(nng_msg *m,uint16_t *vp)

{
  ushort uVar1;
  int iVar2;
  size_t sVar3;
  ushort *puVar4;
  
  sVar3 = nni_msg_len(m);
  iVar2 = 3;
  if (1 < sVar3) {
    puVar4 = (ushort *)nni_msg_body(m);
    uVar1 = *puVar4;
    nni_msg_trim(m,2);
    *vp = uVar1 << 8 | uVar1 >> 8;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
nng_msg_trim_u16(nng_msg *m, uint16_t *vp)
{
	uint8_t *body;
	uint16_t v;
	if (nni_msg_len(m) < sizeof(v)) {
		return (NNG_EINVAL);
	}
	body = nni_msg_body(m);
	NNI_GET16(body, v);
	(void) nni_msg_trim(m, sizeof(v));
	*vp = v;
	return (0);
}